

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

void RunControlFlowOptimization(ExpressionContext *ctx,VmModule *module,VmValue *value)

{
  uint *optCount;
  VmValue **ppVVar1;
  VmValue *pVVar2;
  uint uVar3;
  VmInstruction *pVVar4;
  ulong uVar5;
  VmInstruction *pVVar6;
  VmValue *pVVar7;
  VmValue *replacement;
  VmValue *pVVar8;
  VmInstruction *pVVar9;
  ulong uVar10;
  VmBlock *pVVar11;
  VmValue *pVVar12;
  ulong uVar13;
  VmInstructionType VVar14;
  VmBlock *pVVar15;
  bool bVar16;
  
  if (((value == (VmValue *)0x0) || (value->typeID != 4)) ||
     (pVVar15 = (VmBlock *)value[1].source, pVVar15 == (VmBlock *)0x0)) {
    return;
  }
  optCount = &module->controlFlowSimplifications;
LAB_0019d425:
  for (pVVar9 = pVVar15->firstInstruction; pVVar9 != (VmInstruction *)0x0;
      pVVar9 = pVVar9->nextSibling) {
    uVar3 = pVVar9->cmd - VM_INST_JUMP;
    if ((uVar3 < 0x31) && ((0x1100000000037U >> ((ulong)uVar3 & 0x3f) & 1) != 0)) {
      pVVar4 = pVVar15->lastInstruction;
      if (pVVar4 != pVVar9 && pVVar4 != (VmInstruction *)0x0) goto LAB_0019d467;
      break;
    }
  }
  goto LAB_0019d484;
  while (pVVar4 != pVVar9) {
LAB_0019d467:
    *optCount = *optCount + 1;
    VmBlock::RemoveInstruction(pVVar15,pVVar4);
    pVVar4 = pVVar15->lastInstruction;
    if (pVVar4 == (VmInstruction *)0x0) break;
  }
LAB_0019d484:
  pVVar9 = pVVar15->lastInstruction;
  if (pVVar9 == (VmInstruction *)0x0) goto LAB_0019d966;
  VVar14 = pVVar9->cmd;
  if (VVar14 == VM_INST_JUMP) {
    pVVar11 = pVVar15->nextSibling;
    if (pVVar11 == (VmBlock *)0x0) goto LAB_0019d966;
    if ((pVVar9->arguments).count == 0) goto LAB_0019da6c;
    if ((((VmBlock *)*(pVVar9->arguments).data != pVVar11) ||
        ((pVVar11->super_VmValue).users.count != 1)) ||
       ((VmInstruction *)*(pVVar11->super_VmValue).users.data != pVVar9)) goto LAB_0019d966;
    pVVar4 = pVVar11->firstInstruction;
    if (pVVar11->firstInstruction == (VmInstruction *)0x0) {
LAB_0019d57c:
      pVVar4 = (VmInstruction *)0x0;
      bVar16 = true;
    }
    else {
      do {
        pVVar6 = pVVar4->nextSibling;
        if (pVVar4->cmd == VM_INST_PHI) {
          if (((pVVar4->arguments).count != 2) ||
             (ppVVar1 = (pVVar4->arguments).data, (VmBlock *)ppVVar1[1] != pVVar15)) {
            __assert_fail("inst->arguments.size() == 2 && inst->arguments[1] == curr",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x13c6,
                          "void RunControlFlowOptimization(ExpressionContext &, VmModule *, VmValue *)"
                         );
          }
          anon_unknown.dwarf_107107::ReplaceValueUsersWith
                    (module,&pVVar4->super_VmValue,*ppVVar1,optCount);
        }
        pVVar4 = pVVar6;
      } while (pVVar6 != (VmInstruction *)0x0);
      pVVar4 = pVVar11->firstInstruction;
      bVar16 = pVVar4 == (VmInstruction *)0x0;
      pVVar6 = pVVar4;
      if (bVar16) goto LAB_0019d57c;
      do {
        pVVar6->parent = pVVar15;
        pVVar6 = pVVar6->nextSibling;
      } while (pVVar6 != (VmInstruction *)0x0);
    }
    pVVar6 = pVVar15->lastInstruction;
    if (pVVar6 != (VmInstruction *)0x0) {
      pVVar6->nextSibling = pVVar4;
    }
    if (!bVar16) {
      pVVar4->prevSibling = pVVar6;
      pVVar15->lastInstruction = pVVar11->lastInstruction;
    }
    pVVar11->firstInstruction = (VmInstruction *)0x0;
    pVVar11->lastInstruction = (VmInstruction *)0x0;
    if (pVVar9->parent != (VmBlock *)0x0) {
      VmBlock::RemoveInstruction(pVVar15,pVVar9);
    }
    *optCount = *optCount + 1;
    VVar14 = pVVar9->cmd;
  }
  if (VVar14 - VM_INST_JUMP_Z < 2) {
    if ((pVVar9->arguments).count < 3) goto LAB_0019da6c;
    ppVVar1 = (pVVar9->arguments).data;
    pVVar11 = (VmBlock *)ppVVar1[2];
    if (pVVar11 == pVVar15->nextSibling) {
      pVVar8 = ppVVar1[1];
      VVar14 = (VVar14 == VM_INST_JUMP_Z) + VM_INST_JUMP_Z;
      pVVar9->cmd = VVar14;
      ppVVar1[1] = (VmValue *)pVVar11;
      (pVVar9->arguments).data[2] = pVVar8;
      *optCount = *optCount + 1;
    }
    uVar3 = (pVVar9->arguments).count;
    if (uVar3 == 0) goto LAB_0019da6c;
    ppVVar1 = (pVVar9->arguments).data;
    pVVar4 = (VmInstruction *)*ppVVar1;
    if ((pVVar4 == (VmInstruction *)0x0) || ((pVVar4->super_VmValue).typeID != 2)) {
      pVVar4 = (VmInstruction *)0x0;
    }
    if ((uVar3 == 1) || (uVar3 < 3)) goto LAB_0019da6c;
    if ((pVVar4 != (VmInstruction *)0x0) &&
       ((((pVVar4->cmd == VM_INST_PHI && (pVVar4 == pVVar9->prevSibling)) &&
         (pVVar4 == pVVar15->firstInstruction)) && (uVar3 = (pVVar4->arguments).count, uVar3 != 0)))
       ) {
      pVVar8 = ppVVar1[1];
      pVVar2 = ppVVar1[2];
      uVar5 = 1;
      do {
        ppVVar1 = (pVVar4->arguments).data;
        pVVar7 = ppVVar1[uVar5 - 1];
        if ((pVVar7 == (VmValue *)0x0) || (pVVar7->typeID != 2)) {
          pVVar7 = (VmValue *)0x0;
        }
        uVar13 = (ulong)uVar3;
        if (uVar13 <= uVar5) goto LAB_0019da6c;
        pVVar12 = ppVVar1[uVar5];
        if ((pVVar12 == (VmValue *)0x0) || (pVVar12->typeID != 3)) {
          pVVar12 = (VmValue *)0x0;
        }
        if (*(int *)&pVVar7[1]._vptr_VmValue == 7) {
          if (pVVar7[1].type.type == VM_TYPE_VOID) goto LAB_0019da6c;
          replacement = pVVar8;
          if ((pVVar9->cmd == VM_INST_JUMP_NZ) ==
              (*(int *)(**(long **)&pVVar7[1].typeID + 0x98) == 0)) {
            replacement = pVVar2;
          }
          pVVar7 = *(VmValue **)&pVVar12[1].hasSideEffects;
          if (*(int *)&pVVar7[1]._vptr_VmValue == 0x1c) {
            if (pVVar7[1].type.type == VM_TYPE_VOID) goto LAB_0019da6c;
            if ((VmBlock *)**(undefined8 **)&pVVar7[1].typeID != pVVar15) {
              __assert_fail("terminator->arguments[0] == curr",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x1412,
                            "void RunControlFlowOptimization(ExpressionContext &, VmModule *, VmValue *)"
                           );
            }
            anon_unknown.dwarf_107107::ReplaceValue
                      (module,pVVar7,(VmValue *)**(undefined8 **)&pVVar7[1].typeID,replacement);
            module->controlFlowSimplifications = module->controlFlowSimplifications + 1;
            uVar3 = (pVVar4->arguments).count;
            uVar13 = (ulong)uVar3;
          }
        }
        uVar10 = uVar5 + 1;
        uVar5 = uVar5 + 2;
      } while (uVar10 < uVar13);
      VVar14 = pVVar9->cmd;
      goto LAB_0019d7ae;
    }
  }
  else {
LAB_0019d7ae:
    if (VVar14 == VM_INST_RETURN) {
      if (((((pVVar9->arguments).count == 0) ||
           (pVVar4 = (VmInstruction *)*(pVVar9->arguments).data, pVVar4 == (VmInstruction *)0x0)) ||
          ((pVVar4->super_VmValue).typeID != 2)) ||
         (((pVVar4->cmd != VM_INST_PHI || (pVVar4 != pVVar9->prevSibling)) ||
          ((pVVar4 != pVVar15->firstInstruction || (uVar3 = (pVVar4->arguments).count, uVar3 == 0)))
          ))) goto LAB_0019d966;
      uVar5 = 1;
      do {
        ppVVar1 = (pVVar4->arguments).data;
        pVVar8 = ppVVar1[uVar5 - 1];
        if ((pVVar8 == (VmValue *)0x0) || (pVVar8->typeID != 2)) {
          pVVar8 = (VmValue *)0x0;
        }
        uVar13 = (ulong)uVar3;
        if (uVar13 <= uVar5) goto LAB_0019da6c;
        pVVar6 = *(VmInstruction **)&ppVVar1[uVar5][1].hasSideEffects;
        if (pVVar6->cmd == VM_INST_JUMP) {
          if ((pVVar6->arguments).count == 0) goto LAB_0019da6c;
          if ((VmBlock *)*(pVVar6->arguments).data != pVVar15) {
            __assert_fail("terminator->arguments[0] == curr",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x142c,
                          "void RunControlFlowOptimization(ExpressionContext &, VmModule *, VmValue *)"
                         );
          }
          anon_unknown.dwarf_107107::ChangeInstructionTo
                    ((VmModule *)module->allocator,pVVar6,VM_INST_RETURN,pVVar8,(VmValue *)0x0,
                     (VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,optCount);
          uVar3 = (pVVar4->arguments).count;
          uVar13 = (ulong)uVar3;
        }
        uVar10 = uVar5 + 1;
        uVar5 = uVar5 + 2;
      } while (uVar10 < uVar13);
      VVar14 = pVVar9->cmd;
    }
  }
  if (VVar14 - VM_INST_JUMP_Z < 2) {
    uVar3 = (pVVar9->arguments).count;
    if ((uVar3 < 2) || (uVar3 == 2)) goto LAB_0019da6c;
    ppVVar1 = (pVVar9->arguments).data;
    pVVar8 = ppVVar1[1];
    if (pVVar8 != ppVVar1[2]) goto LAB_0019d966;
    anon_unknown.dwarf_107107::ChangeInstructionTo
              ((VmModule *)module->allocator,pVVar9,VM_INST_JUMP,pVVar8,(VmValue *)0x0,
               (VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,optCount);
    VVar14 = pVVar9->cmd;
  }
  if ((VVar14 == VM_INST_UNYIELD) && ((pVVar9->arguments).count == 2)) {
    anon_unknown.dwarf_107107::ChangeInstructionTo
              ((VmModule *)module->allocator,pVVar9,VM_INST_JUMP,(pVVar9->arguments).data[1],
               (VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,optCount);
  }
LAB_0019d966:
  pVVar15 = pVVar15->nextSibling;
  if (pVVar15 == (VmBlock *)0x0) {
    pVVar15 = (VmBlock *)value[1].source;
    do {
      pVVar11 = pVVar15;
      if (pVVar11 == (VmBlock *)0x0) {
        return;
      }
      pVVar15 = pVVar11->nextSibling;
      pVVar9 = pVVar11->firstInstruction;
      if ((((pVVar9 != (VmInstruction *)0x0) && (pVVar9 == pVVar11->lastInstruction)) &&
          (pVVar9->cmd == VM_INST_JUMP)) && (pVVar11 != (VmBlock *)value[1].source)) {
        if ((pVVar9->arguments).count == 0) {
LAB_0019da6c:
          __assert_fail("index < count",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x199,
                        "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]"
                       );
        }
        pVVar8 = *(pVVar9->arguments).data;
        if ((pVVar8 == (VmValue *)0x0) || (pVVar8->typeID != 3)) {
          __assert_fail("target",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0x1450,
                        "void RunControlFlowOptimization(ExpressionContext &, VmModule *, VmValue *)"
                       );
        }
        uVar5 = (ulong)(pVVar11->super_VmValue).users.count;
        if (uVar5 != 0) {
          uVar13 = 0;
          do {
            pVVar2 = (pVVar11->super_VmValue).users.data[uVar13];
            if (((pVVar2 != (VmValue *)0x0) && (pVVar2->typeID == 2)) &&
               (*(int *)&pVVar2[1]._vptr_VmValue == 0x4d)) goto LAB_0019da2e;
            uVar13 = uVar13 + 1;
          } while (uVar5 != uVar13);
        }
        anon_unknown.dwarf_107107::ReplaceValueUsersWith
                  (module,&pVVar11->super_VmValue,pVVar8,optCount);
      }
LAB_0019da2e:
      if (((pVVar11->super_VmValue).users.count == 0) &&
         (bVar16 = VmBlock::HasExternalInstructionUsers(pVVar11), !bVar16)) {
        VmFunction::RemoveBlock((VmFunction *)value,pVVar11);
        *optCount = *optCount + 1;
      }
    } while( true );
  }
  goto LAB_0019d425;
}

Assistant:

void RunControlFlowOptimization(ExpressionContext &ctx, VmModule *module, VmValue *value)
{
	(void)ctx;

	if(VmFunction *function = getType<VmFunction>(value))
	{
		for(VmBlock *curr = function->firstBlock; curr; curr = curr->nextSibling)
		{
			// Remove any instructions after a branch
			for(VmInstruction *inst = curr->firstInstruction; inst; inst = inst->nextSibling)
			{
				if(IsBlockTerminator(inst->cmd))
				{
					while(curr->lastInstruction && curr->lastInstruction != inst)
					{
						module->controlFlowSimplifications++;

						curr->RemoveInstruction(curr->lastInstruction);
					}
					break;
				}
			}

			// Merge together blocks if a block A ends with a branch to block B and block B only incoming blocks is block A
			VmInstruction *currLastInst = curr->lastInstruction;

			if(currLastInst && currLastInst->cmd == VM_INST_JUMP)
			{
				VmBlock *next = curr->nextSibling;

				if(next && currLastInst->arguments[0] == next && next->users.size() == 1 && next->users[0] == currLastInst)
				{
					// Fixup phi instructions
					for(VmInstruction *inst = next->firstInstruction; inst;)
					{
						VmInstruction *nextInst = inst->nextSibling;

						if(inst->cmd == VM_INST_PHI)
						{
							// Check that phi only expects us to come from the block we are merging with
							assert(inst->arguments.size() == 2 && inst->arguments[1] == curr);

							ReplaceValueUsersWith(module, inst, inst->arguments[0], &module->controlFlowSimplifications);
						}

						inst = nextInst;
					}

					// Steal target block instructions
					for(VmInstruction *inst = next->firstInstruction; inst; inst = inst->nextSibling)
						inst->parent = curr;

					if(curr->lastInstruction)
						curr->lastInstruction->nextSibling = next->firstInstruction;

					if(next->firstInstruction)
					{
						next->firstInstruction->prevSibling = curr->lastInstruction;

						curr->lastInstruction = next->lastInstruction;
					}

					next->firstInstruction = next->lastInstruction = NULL;

					// Remove branch
					if(currLastInst->parent)
						curr->RemoveInstruction(currLastInst);

					module->controlFlowSimplifications++;
				}
			}

			// Reverse conditional branch so that the false block jump will jump further than the true block jump
			if(currLastInst && (currLastInst->cmd == VM_INST_JUMP_Z || currLastInst->cmd == VM_INST_JUMP_NZ))
			{
				VmBlock *next = curr->nextSibling;

				if(currLastInst->arguments[2] == next)
				{
					VmValue *trueBlock = currLastInst->arguments[1];
					VmValue *falseBlock = currLastInst->arguments[2];

					currLastInst->cmd = currLastInst->cmd == VM_INST_JUMP_Z ? VM_INST_JUMP_NZ : VM_INST_JUMP_Z;

					currLastInst->arguments[1] = falseBlock;
					currLastInst->arguments[2] = trueBlock;

					module->controlFlowSimplifications++;
				}
			}

			// If block contains a single conditional jump, and the condition is a phi node with constant arguments, try to redirect predecessor to our target
			if(currLastInst && (currLastInst->cmd == VM_INST_JUMP_Z || currLastInst->cmd == VM_INST_JUMP_NZ))
			{
				VmInstruction *phi = getType<VmInstruction>(currLastInst->arguments[0]);
				VmValue *trueBlock = currLastInst->arguments[1];
				VmValue *falseBlock = currLastInst->arguments[2];

				if(phi && phi->cmd == VM_INST_PHI && phi == currLastInst->prevSibling && phi == curr->firstInstruction)
				{
					for(unsigned i = 0; i < phi->arguments.size(); i += 2)
					{
						VmInstruction *option = getType<VmInstruction>(phi->arguments[i]);
						VmBlock *edge = getType<VmBlock>(phi->arguments[i + 1]);

						if(option->cmd != VM_INST_LOAD_IMMEDIATE)
							continue;

						VmConstant *condition = getType<VmConstant>(option->arguments[0]);

						VmValue *target = condition->iValue != 0 ? (currLastInst->cmd == VM_INST_JUMP_NZ ? trueBlock : falseBlock) : (currLastInst->cmd == VM_INST_JUMP_NZ ? falseBlock : trueBlock);

						VmInstruction *terminator = edge->lastInstruction;

						if(terminator->cmd == VM_INST_JUMP)
						{
							assert(terminator->arguments[0] == curr);

							ReplaceValue(module, terminator, terminator->arguments[0], target);

							module->controlFlowSimplifications++;
						}
					}
				}
			}

			// If block contains a return, and the return value is a phi node with constant arguments, try to return directly from predecessors
			if(currLastInst && currLastInst->cmd == VM_INST_RETURN && !currLastInst->arguments.empty())
			{
				VmInstruction *phi = getType<VmInstruction>(currLastInst->arguments[0]);

				if(phi && phi->cmd == VM_INST_PHI && phi == currLastInst->prevSibling && phi == curr->firstInstruction)
				{
					for(unsigned i = 0; i < phi->arguments.size(); i += 2)
					{
						VmInstruction *option = getType<VmInstruction>(phi->arguments[i]);
						VmBlock *edge = getType<VmBlock>(phi->arguments[i + 1]);

						VmInstruction *terminator = edge->lastInstruction;

						if(terminator->cmd == VM_INST_JUMP)
						{
							assert(terminator->arguments[0] == curr);

							ChangeInstructionTo(module, terminator, VM_INST_RETURN, option, NULL, NULL, NULL, NULL, &module->controlFlowSimplifications);
						}
					}
				}
			}

			// Reverse conditional jump with unconditional if both targets are the same
			if(currLastInst && (currLastInst->cmd == VM_INST_JUMP_Z || currLastInst->cmd == VM_INST_JUMP_NZ))
			{
				VmValue *trueBlock = currLastInst->arguments[1];
				VmValue *falseBlock = currLastInst->arguments[2];

				if(trueBlock == falseBlock)
					ChangeInstructionTo(module, currLastInst, VM_INST_JUMP, trueBlock, NULL, NULL, NULL, NULL, &module->controlFlowSimplifications);
			}

			// Remove coroutine unyield that only contains a single target
			if(currLastInst && currLastInst->cmd == VM_INST_UNYIELD && currLastInst->arguments.size() == 2)
			{
				VmValue *targetBlock = currLastInst->arguments[1];

				ChangeInstructionTo(module, currLastInst, VM_INST_JUMP, targetBlock, NULL, NULL, NULL, NULL, &module->controlFlowSimplifications);
			}
		}

		for(VmBlock *curr = function->firstBlock; curr;)
		{
			VmBlock *next = curr->nextSibling;

			if(curr->firstInstruction && curr->firstInstruction == curr->lastInstruction && curr->firstInstruction->cmd == VM_INST_JUMP && curr != function->firstBlock)
			{
				// Remove blocks that only contain an unconditional branch to some other block
				VmBlock *target = getType<VmBlock>(curr->firstInstruction->arguments[0]);

				assert(target);

				// Do not replace block if it is an incoming phi instruction argument
				bool hasPhiUser = false;

				for(unsigned i = 0; i < curr->users.size(); i++)
				{
					if(VmInstruction *inst = getType<VmInstruction>(curr->users[i]))
					{
						if(inst->cmd == VM_INST_PHI)
						{
							hasPhiUser = true;
							break;
						}
					}
				}

				if(!hasPhiUser)
					ReplaceValueUsersWith(module, curr, target, &module->controlFlowSimplifications);
			}

			if(curr->users.empty() && !curr->HasExternalInstructionUsers())
			{
				// Remove unused blocks
				function->RemoveBlock(curr);

				module->controlFlowSimplifications++;
			}

			curr = next;
		}
	}
}